

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
               *this,SourceCollections *dst)

{
  CaseDef CVar1;
  undefined4 in_stack_ffffffffffffffd8;
  
  CVar1.renderSize.m_data[1] = (this->m_arg0).arg0.renderSize.m_data[0];
  CVar1.renderSize.m_data[0] = in_stack_ffffffffffffffd8;
  CVar1._8_8_ = *(undefined8 *)((this->m_arg0).arg0.renderSize.m_data + 1);
  CVar1.numSamples = (this->m_arg0).arg0.colorFormat;
  (*(this->m_progs).m_func)(dst,CVar1);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }